

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  DOHcode DVar1;
  CURLMcode CVar2;
  timediff_t tVar3;
  dynbuf *pdVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  long mask;
  dynbuf *resp;
  DOHcode d;
  timediff_t timeout_ms;
  Curl_easy *pCStack_48;
  CURLcode result;
  Curl_easy *doh;
  CURLM *multi_local;
  char *url_local;
  char *host_local;
  dnsprobe *pdStack_20;
  DNStype dnstype_local;
  dnsprobe *p_local;
  Curl_easy *data_local;
  
  pCStack_48 = (Curl_easy *)0x0;
  doh = (Curl_easy *)multi;
  multi_local = (CURLM *)url;
  url_local = host;
  host_local._4_4_ = dnstype;
  pdStack_20 = p;
  p_local = (dnsprobe *)data;
  DVar1 = doh_encode(host,dnstype,p->dohbuffer,0x200,&p->dohlen);
  if (DVar1 == DOH_OK) {
    pdStack_20->dnstype = host_local._4_4_;
    Curl_dyn_init(&pdStack_20->serverdoh,3000);
    tVar3 = Curl_timeleft((Curl_easy *)p_local,(curltime *)0x0,true);
    if (tVar3 < 1) {
      timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      timeout_ms._4_4_ = Curl_open(&stack0xffffffffffffffb8);
      if (timeout_ms._4_4_ == CURLE_OK) {
        pdVar4 = &pdStack_20->serverdoh;
        *(uint *)&(pCStack_48->state).field_0x74c =
             *(uint *)&(pCStack_48->state).field_0x74c & 0xffdfffff | 0x200000;
        timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_URL,multi_local);
        if ((((((((timeout_ms._4_4_ == CURLE_OK) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_DEFAULT_PROTOCOL,"https"),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
              (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_WRITEFUNCTION,doh_write_cb),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
             (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_WRITEDATA,pdVar4),
               timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
              (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
            ((((((timeout_ms._4_4_ =
                       curl_easy_setopt(pCStack_48,CURLOPT_POSTFIELDS,pdStack_20->dohbuffer),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               ((((timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_POSTFIELDSIZE,pdStack_20->dohlen),
                  timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_HTTPHEADER,headers),
                  timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
              (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_HTTP_VERSION,4),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
             ((((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_PIPEWAIT,1),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
              ((((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_PROTOCOLS,2),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_TIMEOUT_MS,tVar3),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))) &&
           ((((timeout_ms._4_4_ =
                    curl_easy_setopt(pCStack_48,CURLOPT_SHARE,
                                     *(undefined8 *)(p_local->dohbuffer + 0xc4)),
              timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
             (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
            (((((*(long *)(p_local->dohbuffer + 0x18c) == 0 ||
                (*(long *)(p_local->dohbuffer + 0x18c) == _stderr)) ||
               (timeout_ms._4_4_ =
                     curl_easy_setopt(pCStack_48,CURLOPT_STDERR,
                                      *(undefined8 *)(p_local->dohbuffer + 0x18c)),
               timeout_ms._4_4_ == CURLE_OK)) ||
              ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN || (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)
               ))) && (((((*(ulong *)(p_local[4].dohbuffer + 0x166) >> 0x1c & 1) == 0 ||
                         ((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_VERBOSE,1),
                          timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)))
                         ) || (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                       (((((*(ulong *)(p_local[4].dohbuffer + 0x166) >> 0x20 & 1) == 0 ||
                          (timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_NOSIGNAL,1),
                          timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)
                         ) || (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))) {
          uVar10 = 0;
          if (((uint)((ulong)*(undefined8 *)(p_local[4].dohbuffer + 0x166) >> 0x33) & 1) != 0) {
            uVar10 = 2;
          }
          timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_SSL_VERIFYHOST,uVar10);
          if (((((timeout_ms._4_4_ == CURLE_OK) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
              (((timeout_ms._4_4_ =
                      curl_easy_setopt(pCStack_48,CURLOPT_SSL_VERIFYPEER,
                                       (ulong)(((uint)((ulong)*(undefined8 *)
                                                               (p_local[4].dohbuffer + 0x166) >>
                                                      0x32) & 1) != 0)),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
             ((((((timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_SSL_VERIFYSTATUS,
                                         (ulong)(((uint)((ulong)*(undefined8 *)
                                                                 (p_local[4].dohbuffer + 0x166) >>
                                                        0x34) & 1) != 0)),
                  timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                ((((p_local[2].dohbuffer[300] >> 1 & 1) == 0 ||
                  (timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_SSL_FALSESTART,1),
                  timeout_ms._4_4_ == CURLE_OK)) ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
               ((((*(long *)(p_local[3].dohbuffer + 0x10c) == 0 ||
                  (timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_CAINFO,
                                         *(undefined8 *)(p_local[3].dohbuffer + 0x10c)),
                  timeout_ms._4_4_ == CURLE_OK)) ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                ((((((*(long *)(p_local[4].dohbuffer + 0xa4) == 0 ||
                     (timeout_ms._4_4_ =
                           curl_easy_setopt(pCStack_48,CURLOPT_CAINFO_BLOB,
                                            *(undefined8 *)(p_local[4].dohbuffer + 0xa4)),
                     timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                  (((*(long *)(p_local[3].dohbuffer + 0xfc) == 0 ||
                    (timeout_ms._4_4_ =
                          curl_easy_setopt(pCStack_48,CURLOPT_CAPATH,
                                           *(undefined8 *)(p_local[3].dohbuffer + 0xfc)),
                    timeout_ms._4_4_ == CURLE_OK)) ||
                   ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                    (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
                 (((((*(long *)(p_local[3].dohbuffer + 0x154) == 0 ||
                     (timeout_ms._4_4_ =
                           curl_easy_setopt(pCStack_48,CURLOPT_CRLFILE,
                                            *(undefined8 *)(p_local[3].dohbuffer + 0x154)),
                     timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                  ((((((p_local[2].dohbuffer[300] & 1) == 0 ||
                      (timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_CERTINFO,1),
                      timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                    (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                   (((*(long *)(p_local[2].dohbuffer + 0xf4) == 0 ||
                     (timeout_ms._4_4_ =
                           curl_easy_setopt(pCStack_48,CURLOPT_SSL_CTX_FUNCTION,
                                            *(undefined8 *)(p_local[2].dohbuffer + 0xf4)),
                     timeout_ms._4_4_ == CURLE_OK)) ||
                    ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                     (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))))))) &&
              (((((*(long *)(p_local[2].dohbuffer + 0xfc) == 0 ||
                  (timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_SSL_CTX_DATA,
                                         *(undefined8 *)(p_local[2].dohbuffer + 0xfc)),
                  timeout_ms._4_4_ == CURLE_OK)) ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                ((((p_local[1].easy == (CURL_conflict *)0x0 ||
                   (timeout_ms._4_4_ =
                         curl_easy_setopt(pCStack_48,CURLOPT_DEBUGFUNCTION,p_local[1].easy),
                   timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
               ((((*(long *)(p_local->dohbuffer + 0x194) == 0 ||
                  (timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_DEBUGDATA,
                                         *(undefined8 *)(p_local->dohbuffer + 0x194)),
                  timeout_ms._4_4_ == CURLE_OK)) ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                (((*(long *)(p_local[4].dohbuffer + 0x4c) == 0 ||
                  (timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_SSL_EC_CURVES,
                                         *(undefined8 *)(p_local[4].dohbuffer + 0x4c)),
                  timeout_ms._4_4_ == CURLE_OK)) ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))))) {
            uVar5 = 0;
            if ((p_local[2].dohbuffer[300] >> 3 & 1) != 0) {
              uVar5 = 2;
            }
            uVar6 = 0;
            if ((p_local[2].dohbuffer[300] >> 4 & 1) != 0) {
              uVar6 = 4;
            }
            uVar7 = 0;
            if ((p_local[2].dohbuffer[300] >> 5 & 1) != 0) {
              uVar7 = 8;
            }
            uVar8 = 0;
            if ((p_local[2].dohbuffer[300] >> 6 & 1) != 0) {
              uVar8 = 0x10;
            }
            uVar9 = 0;
            if ((char)p_local[2].dohbuffer[300] < '\0') {
              uVar9 = 0x20;
            }
            curl_easy_setopt(pCStack_48,CURLOPT_SSL_OPTIONS,
                             (long)(int)((p_local[2].dohbuffer[300] >> 2 & 1) != 0 | uVar5 | uVar6 |
                                         uVar7 | uVar8 | uVar9));
            (pCStack_48->set).fmultidone = doh_done;
            (pCStack_48->set).dohfor = (Curl_easy *)p_local;
            pdStack_20->easy = pCStack_48;
            CVar2 = curl_multi_add_handle((Curl_multi *)doh,pCStack_48);
            if (CVar2 == CURLM_OK) {
              return CURLE_OK;
            }
          }
        }
      }
    }
    Curl_close(&stack0xffffffffffffffb8);
    data_local._4_4_ = timeout_ms._4_4_;
  }
  else {
    Curl_failf((Curl_easy *)p_local,"Failed to encode DoH packet [%d]",(ulong)DVar1);
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->serverdoh, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dynbuf *resp = &p->serverdoh;
    doh->state.internal = true;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
    ERROR_CHECK_SETOPT(CURLOPT_PIPEWAIT, 1L);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
    /* in debug mode, also allow http */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    ERROR_CHECK_SETOPT(CURLOPT_SHARE, data->share);
    if(data->set.err && data->set.err != stderr)
      ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
      data->set.doh_verifyhost ? 2L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
      data->set.doh_verifypeer ? 1L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
      data->set.doh_verifystatus ? 1L : 0L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661

       Note DoH does not inherit the user's proxy server so proxy SSL settings
       have no effect and are not inherited. If that changes then two new
       options should be added to check doh proxy insecure separately,
       CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
       */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.str[STRING_SSL_CAFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                         data->set.str[STRING_SSL_CAFILE]);
    }
    if(data->set.blobs[BLOB_CAINFO]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                         data->set.blobs[BLOB_CAINFO]);
    }
    if(data->set.str[STRING_SSL_CAPATH]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                         data->set.str[STRING_SSL_CAPATH]);
    }
    if(data->set.str[STRING_SSL_CRLFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                         data->set.str[STRING_SSL_CRLFILE]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
    if(data->set.fdebug)
      ERROR_CHECK_SETOPT(CURLOPT_DEBUGFUNCTION, data->set.fdebug);
    if(data->set.debugdata)
      ERROR_CHECK_SETOPT(CURLOPT_DEBUGDATA, data->set.debugdata);
    if(data->set.str[STRING_SSL_EC_CURVES]) {
      ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                         data->set.str[STRING_SSL_EC_CURVES]);
    }

    {
      long mask =
        (data->set.ssl.enable_beast ?
         CURLSSLOPT_ALLOW_BEAST : 0) |
        (data->set.ssl.no_revoke ?
         CURLSSLOPT_NO_REVOKE : 0) |
        (data->set.ssl.no_partialchain ?
         CURLSSLOPT_NO_PARTIALCHAIN : 0) |
        (data->set.ssl.revoke_best_effort ?
         CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
        (data->set.ssl.native_ca_store ?
         CURLSSLOPT_NATIVE_CA : 0) |
        (data->set.ssl.auto_client_cert ?
         CURLSSLOPT_AUTO_CLIENT_CERT : 0);

      (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
    }

    doh->set.fmultidone = doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* DoH handles must not inherit private_data. The handles may be passed to
       the user via callbacks and the user will be able to identify them as
       internal handles because private data is not set. The user can then set
       private_data via CURLOPT_PRIVATE if they so choose. */
    DEBUGASSERT(!doh->set.private_data);

    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  return CURLE_OK;

error:
  Curl_close(&doh);
  return result;
}